

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlSetUniformSampler(int locIndex,uint textureId)

{
  long lVar1;
  int i;
  
  lVar1 = 0;
  do {
    if (RLGL.State.activeTextureId[lVar1] == textureId) {
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    if (RLGL.State.activeTextureId[lVar1] == 0) {
      (*glad_glUniform1i)(locIndex,(int)lVar1 + 1);
      RLGL.State.activeTextureId[lVar1] = textureId;
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void rlSetUniformSampler(int locIndex, unsigned int textureId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Check if texture is already active
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) if (RLGL.State.activeTextureId[i] == textureId) return;

    // Register a new active texture for the internal batch system
    // NOTE: Default texture is always activated as GL_TEXTURE0
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
    {
        if (RLGL.State.activeTextureId[i] == 0)
        {
            glUniform1i(locIndex, 1 + i);              // Activate new texture unit
            RLGL.State.activeTextureId[i] = textureId; // Save texture id for binding on drawing
            break;
        }
    }
#endif
}